

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DriveStrengthSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DriveStrengthSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,Token *args_3,Token *args_4)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  TokenKind TVar22;
  undefined1 uVar23;
  NumericTokenFlags NVar24;
  uint32_t uVar25;
  DriveStrengthSyntax *pDVar26;
  
  pDVar26 = (DriveStrengthSyntax *)allocate(this,0x68,8);
  TVar6 = args->kind;
  uVar7 = args->field_0x2;
  NVar8.raw = (args->numFlags).raw;
  uVar9 = args->rawLen;
  pIVar1 = args->info;
  TVar10 = args_1->kind;
  uVar11 = args_1->field_0x2;
  NVar12.raw = (args_1->numFlags).raw;
  uVar13 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar14 = args_2->kind;
  uVar15 = args_2->field_0x2;
  NVar16.raw = (args_2->numFlags).raw;
  uVar17 = args_2->rawLen;
  pIVar3 = args_2->info;
  TVar18 = args_3->kind;
  uVar19 = args_3->field_0x2;
  NVar20.raw = (args_3->numFlags).raw;
  uVar21 = args_3->rawLen;
  pIVar4 = args_3->info;
  TVar22 = args_4->kind;
  uVar23 = args_4->field_0x2;
  NVar24.raw = (args_4->numFlags).raw;
  uVar25 = args_4->rawLen;
  pIVar5 = args_4->info;
  (pDVar26->super_NetStrengthSyntax).super_SyntaxNode.kind = DriveStrength;
  (pDVar26->super_NetStrengthSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pDVar26->super_NetStrengthSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pDVar26->openParen).kind = TVar6;
  (pDVar26->openParen).field_0x2 = uVar7;
  (pDVar26->openParen).numFlags = (NumericTokenFlags)NVar8.raw;
  (pDVar26->openParen).rawLen = uVar9;
  (pDVar26->openParen).info = pIVar1;
  (pDVar26->strength0).kind = TVar10;
  (pDVar26->strength0).field_0x2 = uVar11;
  (pDVar26->strength0).numFlags = (NumericTokenFlags)NVar12.raw;
  (pDVar26->strength0).rawLen = uVar13;
  (pDVar26->strength0).info = pIVar2;
  (pDVar26->comma).kind = TVar14;
  (pDVar26->comma).field_0x2 = uVar15;
  (pDVar26->comma).numFlags = (NumericTokenFlags)NVar16.raw;
  (pDVar26->comma).rawLen = uVar17;
  (pDVar26->comma).info = pIVar3;
  (pDVar26->strength1).kind = TVar18;
  (pDVar26->strength1).field_0x2 = uVar19;
  (pDVar26->strength1).numFlags = (NumericTokenFlags)NVar20.raw;
  (pDVar26->strength1).rawLen = uVar21;
  (pDVar26->strength1).info = pIVar4;
  (pDVar26->closeParen).kind = TVar22;
  (pDVar26->closeParen).field_0x2 = uVar23;
  (pDVar26->closeParen).numFlags = (NumericTokenFlags)NVar24.raw;
  (pDVar26->closeParen).rawLen = uVar25;
  (pDVar26->closeParen).info = pIVar5;
  return pDVar26;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }